

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void __thiscall FWeaponSlots::SendDifferences(FWeaponSlots *this,int playernum,FWeaponSlots *other)

{
  FWeaponSlot *pFVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar8 = 0;
  do {
    if (lVar8 == 10) {
      return;
    }
    uVar2 = other->Slots[lVar8].Weapons.Count;
    uVar4 = (ulong)uVar2;
    pFVar1 = this->Slots + lVar8;
    if (uVar2 == this->Slots[lVar8].Weapons.Count) {
      uVar6 = uVar4;
      lVar5 = uVar4 << 4;
      do {
        if ((int)uVar6 < 1) goto LAB_0056a6c4;
        uVar6 = uVar6 - 1;
        if (uVar6 < uVar4) {
          lVar9 = *(long *)((long)&other->Slots[lVar8].Weapons.Array[-1].Type + lVar5);
          lVar7 = *(long *)((long)&(pFVar1->Weapons).Array[-1].Type + lVar5);
        }
        else {
          lVar9 = 0;
          lVar7 = 0;
        }
        lVar5 = lVar5 + -0x10;
      } while (lVar9 == lVar7);
    }
    iVar3 = 0x39;
    if (consoleplayer != playernum) {
      Net_WriteByte('C');
      iVar3 = playernum;
    }
    Net_WriteByte((BYTE)iVar3);
    Net_WriteByte((BYTE)lVar8);
    Net_WriteByte((BYTE)(pFVar1->Weapons).Count);
    lVar9 = 0;
    for (lVar5 = 0; lVar5 < (int)(pFVar1->Weapons).Count; lVar5 = lVar5 + 1) {
      Net_WriteWeapon(*(PClassWeapon **)((long)&((pFVar1->Weapons).Array)->Type + lVar9));
      lVar9 = lVar9 + 0x10;
    }
LAB_0056a6c4:
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void FWeaponSlots::SendDifferences(int playernum, const FWeaponSlots &other)
{
	int i, j;

	for (i = 0; i < NUM_WEAPON_SLOTS; ++i)
	{
		if (other.Slots[i].Size() == Slots[i].Size())
		{
			for (j = (int)Slots[i].Size(); j-- > 0; )
			{
				if (other.Slots[i].GetWeapon(j) != Slots[i].GetWeapon(j))
				{
					break;
				}
			}
			if (j < 0)
			{ // The two slots are the same.
				continue;
			}
		}
		// The slots differ. Send mine.
		if (playernum == consoleplayer)
		{
			Net_WriteByte(DEM_SETSLOT);
		}
		else
		{
			Net_WriteByte(DEM_SETSLOTPNUM);
			Net_WriteByte(playernum);
		}
		Net_WriteByte(i);
		Net_WriteByte(Slots[i].Size());
		for (j = 0; j < Slots[i].Size(); ++j)
		{
			Net_WriteWeapon(Slots[i].GetWeapon(j));
		}
	}
}